

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall
r_code::list<core::P<r_exec::_GMonitor>_>::push_front
          (list<core::P<r_exec::_GMonitor>_> *this,P<r_exec::_GMonitor> *t)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  
  if (this->free_cell_count == 0) {
    push_front_new_cell(this,t);
    pcVar1 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::_GMonitor>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_GMonitor>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = this->used_cells_head;
    lVar2 = pcVar1[lVar3].next;
  }
  else {
    lVar3 = this->free_cells;
    pcVar1 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::_GMonitor>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_GMonitor>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar3;
    this->free_cells = pcVar1->next;
    this->free_cell_count = this->free_cell_count - 1;
    core::P<r_exec::_GMonitor>::operator=(&pcVar1->data,t);
    pcVar1 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::_GMonitor>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_GMonitor>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = this->used_cells_head;
    pcVar1[lVar3].next = lVar2;
    pcVar1[lVar3].prev = -1;
    this->used_cells_head = lVar3;
  }
  if (lVar2 != -1) {
    pcVar1[lVar2].prev = lVar3;
  }
  if (this->used_cells_tail == -1) {
    this->used_cells_tail = lVar3;
  }
  this->used_cell_count = this->used_cell_count + 1;
  return;
}

Assistant:

void push_front(const T &t)
    {
        if (free_cell_count) {
            push_front_free_cell(t);
        } else {
            push_front_new_cell(t);
        }

        update_used_cells_head_state();
    }